

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<11,_0,_13,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vec4 *local_140;
  ulong local_138;
  float local_130 [6];
  float local_118 [4];
  float local_108 [6];
  float local_f0 [3];
  float local_e4 [3];
  Matrix<float,_4,_4> local_d8;
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_58;
  
  pfVar1 = (float *)&local_58;
  local_58.m_data.m_data[3].m_data[0] = 0.0;
  local_58.m_data.m_data[3].m_data[1] = 0.0;
  local_58.m_data.m_data[3].m_data[2] = 0.0;
  local_58.m_data.m_data[3].m_data[3] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[1] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[3] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[3] = 0.0;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[0].m_data[3] = 0.0;
  puVar2 = &s_constInMat4;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  pfVar1 = (float *)&local_98;
  local_98.m_data.m_data[3].m_data[0] = 0.0;
  local_98.m_data.m_data[3].m_data[1] = 0.0;
  local_98.m_data.m_data[3].m_data[2] = 0.0;
  local_98.m_data.m_data[3].m_data[3] = 0.0;
  local_98.m_data.m_data[2].m_data[0] = 0.0;
  local_98.m_data.m_data[2].m_data[1] = 0.0;
  local_98.m_data.m_data[2].m_data[2] = 0.0;
  local_98.m_data.m_data[2].m_data[3] = 0.0;
  local_98.m_data.m_data[1].m_data[0] = 0.0;
  local_98.m_data.m_data[1].m_data[1] = 0.0;
  local_98.m_data.m_data[1].m_data[2] = 0.0;
  local_98.m_data.m_data[1].m_data[3] = 0.0;
  local_98.m_data.m_data[0].m_data[0] = 0.0;
  local_98.m_data.m_data[0].m_data[1] = 0.0;
  local_98.m_data.m_data[0].m_data[2] = 0.0;
  local_98.m_data.m_data[0].m_data[3] = 0.0;
  puVar2 = &DAT_02292ac0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  tcu::operator+(&local_d8,&local_58,&local_98);
  local_e4[0] = local_d8.m_data.m_data[0].m_data[0];
  local_e4[1] = local_d8.m_data.m_data[0].m_data[1];
  local_e4[2] = local_d8.m_data.m_data[0].m_data[2];
  local_f0[0] = local_d8.m_data.m_data[1].m_data[1];
  local_f0[1] = local_d8.m_data.m_data[1].m_data[2];
  local_f0[2] = local_d8.m_data.m_data[1].m_data[3];
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  lVar3 = 0;
  do {
    local_118[lVar3] = local_108[lVar3 + 9] + local_108[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_108[3] = local_d8.m_data.m_data[2].m_data[2];
  local_108[4] = local_d8.m_data.m_data[2].m_data[3];
  local_108[5] = local_d8.m_data.m_data[2].m_data[0];
  local_140 = (Vec4 *)0x0;
  local_138 = local_138 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_140 + lVar3 * 4) = local_118[lVar3] + local_108[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_108[0] = local_d8.m_data.m_data[3].m_data[3];
  local_108[1] = local_d8.m_data.m_data[3].m_data[0];
  local_108[2] = local_d8.m_data.m_data[3].m_data[1];
  local_130[2] = 0.0;
  local_130[3] = 0.0;
  local_130[4] = 0.0;
  lVar3 = 0;
  do {
    local_130[lVar3 + 2] = *(float *)((long)&local_140 + lVar3 * 4) + local_108[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_140 = &evalCtx->color;
  local_138 = 0x100000000;
  local_130[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_140 + lVar3 * 4)] = local_130[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) + getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}